

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O2

xmlSchematronParserCtxtPtr xmlSchematronNewMemParserCtxt(char *buffer,int size)

{
  xmlSchematronParserCtxtPtr ctxt;
  xmlDictPtr pxVar1;
  xmlXPathContextPtr pxVar2;
  
  if (0 < size && buffer != (char *)0x0) {
    ctxt = (xmlSchematronParserCtxtPtr)(*xmlMalloc)(0x90);
    if (ctxt == (xmlSchematronParserCtxtPtr)0x0) {
      xmlSchematronPErrMemory((xmlSchematronParserCtxtPtr)0x0);
      return (xmlSchematronParserCtxtPtr)0x0;
    }
    memset(ctxt,0,0x90);
    ctxt->buffer = buffer;
    ctxt->size = size;
    pxVar1 = xmlDictCreate();
    ctxt->dict = pxVar1;
    pxVar2 = xmlXPathNewContext((xmlDocPtr)0x0);
    ctxt->xctxt = pxVar2;
    if (pxVar2 != (xmlXPathContextPtr)0x0) {
      return ctxt;
    }
    xmlSchematronPErrMemory((xmlSchematronParserCtxtPtr)0x0);
    xmlSchematronFreeParserCtxt(ctxt);
  }
  return (xmlSchematronParserCtxtPtr)0x0;
}

Assistant:

xmlSchematronParserCtxtPtr
xmlSchematronNewMemParserCtxt(const char *buffer, int size)
{
    xmlSchematronParserCtxtPtr ret;

    if ((buffer == NULL) || (size <= 0))
        return (NULL);

    ret =
        (xmlSchematronParserCtxtPtr)
        xmlMalloc(sizeof(xmlSchematronParserCtxt));
    if (ret == NULL) {
        xmlSchematronPErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronParserCtxt));
    ret->buffer = buffer;
    ret->size = size;
    ret->dict = xmlDictCreate();
    ret->xctxt = xmlXPathNewContext(NULL);
    if (ret->xctxt == NULL) {
        xmlSchematronPErrMemory(NULL);
        xmlSchematronFreeParserCtxt(ret);
        return (NULL);
    }
    return (ret);
}